

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL> *pOVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  
  *(undefined8 *)&this[-1].super_IfcRelDecomposes.field_0x28 = 0x8c8b78;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0x10 = 0x8c8bf0;
  *(undefined8 *)
   &this[-1].super_IfcRelDecomposes.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x18 = 0x8c8ba0;
  *(undefined8 *)&this[-1].super_IfcRelDecomposes.field_0xc0 = 0x8c8bc8;
  pvVar2 = *(void **)&this[-1].super_IfcRelDecomposes.field_0xd8;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this[-1].field_0xe8 - (long)pvVar2);
  }
  *(undefined8 *)&this[-1].super_IfcRelDecomposes.field_0x28 = 0x8c8c90;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0x10 = 0x8c8cb8;
  puVar3 = *(undefined1 **)&this[-1].super_IfcRelDecomposes.field_0x88;
  pOVar1 = &this[-1].super_IfcRelDecomposes.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL> *)puVar3 != pOVar1) {
    operator_delete(puVar3,(long)pOVar1->_vptr_ObjectHelper + 1);
  }
  puVar4 = *(undefined1 **)&this[-1].super_IfcRelDecomposes.field_0x60;
  puVar3 = &this[-1].super_IfcRelDecomposes.field_0x70;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  puVar3 = *(undefined1 **)&this[-1].super_IfcRelDecomposes.field_0x38;
  puVar4 = &this[-1].super_IfcRelDecomposes.field_0x48;
  if (puVar3 != puVar4) {
    operator_delete(puVar3,*(long *)puVar4 + 1);
  }
  operator_delete(&this[-1].super_IfcRelDecomposes.field_0x28,0xf0);
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}